

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoDeriveMatches(Nf_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Wec_t *p_00;
  Vec_Wrd_t *vStore;
  word *pwVar2;
  int *piVar3;
  Mio_Cell2_t *pMVar4;
  long lVar5;
  long lVar6;
  int nPerms [7];
  int *pPerm [7];
  int *pComp [7];
  
  p_00 = Vec_WecAlloc((int)p);
  vStore = (Vec_Wrd_t *)malloc(0x10);
  vStore->nCap = 10000;
  vStore->nSize = 0;
  pwVar2 = (word *)malloc(80000);
  vStore->pArray = pwVar2;
  Vec_WecPushLevel(p_00);
  Vec_WecPushLevel(p_00);
  for (lVar6 = 1; lVar6 != 7; lVar6 = lVar6 + 1) {
    piVar3 = Extra_GreyCodeSchedule((int)lVar6);
    pComp[lVar6] = piVar3;
  }
  for (lVar6 = 1; lVar6 != 7; lVar6 = lVar6 + 1) {
    piVar3 = Extra_PermSchedule((int)lVar6);
    pPerm[lVar6] = piVar3;
  }
  for (lVar6 = 1; lVar6 != 7; lVar6 = lVar6 + 1) {
    iVar1 = Extra_Factorial((int)lVar6);
    nPerms[lVar6] = iVar1;
  }
  pMVar4 = Mio_CollectRootsNewDefault2(6,&p->nCells,fVerbose);
  p->pCells = pMVar4;
  lVar5 = 0xd0;
  for (lVar6 = 2; lVar6 < p->nCells; lVar6 = lVar6 + 1) {
    Nf_StoCreateGateMaches
              (p,(Mio_Cell2_t *)((long)p->pCells->Delays + lVar5 + -0x30),pComp,pPerm,nPerms,p_00,
               vStore);
    lVar5 = lVar5 + 0x68;
  }
  for (lVar6 = 1; lVar6 != 7; lVar6 = lVar6 + 1) {
    if (pComp[lVar6] != (int *)0x0) {
      free(pComp[lVar6]);
      pComp[lVar6] = (int *)0x0;
    }
  }
  for (lVar6 = 1; lVar6 != 7; lVar6 = lVar6 + 1) {
    if (pPerm[lVar6] != (int *)0x0) {
      free(pPerm[lVar6]);
      pPerm[lVar6] = (int *)0x0;
    }
  }
  Vec_WecFree(p_00);
  free(vStore->pArray);
  free(vStore);
  return;
}

Assistant:

void Nf_StoDeriveMatches( Nf_Man_t * p, int fVerbose )
{
//    abctime clk = Abc_Clock();
    Vec_Wec_t * vProfs = Vec_WecAlloc( 1000 );
    Vec_Wrd_t * vStore = Vec_WrdAlloc( 10000 );
    int * pComp[7], * pPerm[7], nPerms[7], i;
    Vec_WecPushLevel( vProfs );
    Vec_WecPushLevel( vProfs );
    for ( i = 1; i <= 6; i++ )
        pComp[i] = Extra_GreyCodeSchedule( i );
    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );
    p->pCells = Mio_CollectRootsNewDefault2( 6, &p->nCells, fVerbose );
    for ( i = 2; i < p->nCells; i++ )
        Nf_StoCreateGateMaches( p, p->pCells + i, pComp, pPerm, nPerms, vProfs, vStore );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pComp[i] );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    Vec_WecFree( vProfs );
    Vec_WrdFree( vStore );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}